

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O3

path * __thiscall CPath::remove_filename_abi_cxx11_(CPath *this)

{
  pointer pcVar1;
  char cVar2;
  string_type ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (this->super_path)._M_pathname._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->super_path)._M_pathname._M_string_length);
  cVar2 = std::__cxx11::string::rfind((char)this,0x2f);
  std::__cxx11::string::resize((ulong)&local_38,cVar2 + '\x01');
  std::filesystem::__cxx11::path::assign<std::__cxx11::string>(&this->super_path,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return &this->super_path;
}

Assistant:

path& remove_filename()
	{
		auto ns = native();

		ns.resize(native().find_last_of(preferred_separator) + 1);
		assign(ns);

		return *this;
	}